

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,uint *key,InductionVariable *value)

{
  BaseDictionary<unsigned_int,InductionVariable,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
  *pBVar1;
  undefined8 *puVar2;
  hash_t hashCode;
  long lVar3;
  code *pcVar4;
  char cVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  StackSym *pSVar10;
  undefined4 *puVar11;
  long lVar12;
  int iVar13;
  uint depth;
  long lVar14;
  uint uVar15;
  InductionVariable *this_00;
  
  lVar14 = *(long *)this;
  if (lVar14 == 0) {
    BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  hashCode = *key * 2 + 1;
  uVar8 = BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
          ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar15 = *(uint *)(lVar14 + (ulong)uVar8 * 4);
  if ((int)uVar15 < 0) {
    cVar5 = (char)(uVar15 >> 0x18);
    depth = 0;
  }
  else {
    lVar14 = *(long *)(this + 8);
    depth = 0;
    do {
      this_00 = (InductionVariable *)((ulong)uVar15 * 0x20 + lVar14);
      pSVar10 = InductionVariable::Sym(this_00);
      if ((pSVar10->super_Sym).m_id == *key) {
        if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar7) {
          *puVar11 = 0;
          return -1;
        }
        goto LAB_004b5e18;
      }
      depth = depth + 1;
      uVar15 = *(uint *)&this_00[1].sym;
    } while (-1 < (int)uVar15);
    cVar5 = (char)(uVar15 >> 0x18);
  }
  if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(*(DictionaryStats **)(this + 0x30),depth);
  }
  iVar13 = -1;
  if (cVar5 < '\0') {
    if (*(int *)(this + 0x28) == 0) {
      iVar13 = *(int *)(this + 0x20);
      if (iVar13 == *(int *)(this + 0x18)) {
        BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
        ::Resize((BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this);
        uVar8 = BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
        iVar13 = *(int *)(this + 0x20);
      }
      *(int *)(this + 0x20) = iVar13 + 1;
      if (*(int *)(this + 0x18) < iVar13 + 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar7) goto LAB_004b5e18;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x18) <= iVar13) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar7) goto LAB_004b5e18;
        *puVar11 = 0;
      }
    }
    else {
      if (*(int *)(this + 0x28) < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar7) goto LAB_004b5e18;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x24) < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar7) goto LAB_004b5e18;
        *puVar11 = 0;
      }
      if (*(int *)(this + 0x20) <= *(int *)(this + 0x24)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar7) {
LAB_004b5e18:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar11 = 0;
      }
      iVar13 = *(int *)(this + 0x24);
      pBVar1 = this + 0x28;
      *(int *)pBVar1 = *(int *)pBVar1 + -1;
      if (*(int *)pBVar1 != 0) {
        iVar9 = BaseDictionary<unsigned_int,_InductionVariable,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                ::GetNextFreeEntryIndex((EntryType *)((long)iVar13 * 0x20 + *(long *)(this + 8)));
        *(int *)(this + 0x24) = iVar9;
      }
    }
    lVar14 = *(long *)(this + 8);
    lVar12 = (long)iVar13 * 0x20;
    *(undefined8 *)(lVar14 + 0xd + lVar12) =
         *(undefined8 *)((long)&(value->changeBounds).lowerBound + 1);
    uVar6 = *(undefined8 *)&value->symValueNumber;
    puVar2 = (undefined8 *)(lVar14 + lVar12);
    *puVar2 = value->sym;
    puVar2[1] = uVar6;
    lVar14 = *(long *)this;
    lVar3 = *(long *)(this + 8);
    *(undefined4 *)(lVar3 + 0x18 + lVar12) = *(undefined4 *)(lVar14 + (ulong)uVar8 * 4);
    *(int *)(lVar14 + (ulong)uVar8 * 4) = iVar13;
    uVar8 = 0;
    iVar9 = iVar13;
    do {
      iVar9 = *(int *)(lVar3 + 0x18 + (long)iVar9 * 0x20);
      uVar8 = uVar8 + 1;
    } while (iVar9 != -1);
    if (*(DictionaryStats **)(this + 0x30) != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(*(DictionaryStats **)(this + 0x30),uVar8);
    }
  }
  return iVar13;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }